

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QTextBrowserPrivate::HistoryEntry>::clear(QList<QTextBrowserPrivate::HistoryEntry> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QGenericArrayOps<QTextBrowserPrivate::HistoryEntry> *this_00;
  __off_t __length;
  QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QTextBrowserPrivate::HistoryEntry> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::QArrayDataPointer
                (pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QGenericArrayOps<QTextBrowserPrivate::HistoryEntry> *)
                QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>::truncate
                (this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }